

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::Symbol::
visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>&>
          (Symbol *this,TypePrinter *visitor,basic_string_view<char,_std::char_traits<char>_> *args)

{
  SymbolKind SVar1;
  string_view overrideName;
  string_view overrideName_00;
  string_view overrideName_01;
  string_view overrideName_02;
  string_view overrideName_03;
  string_view overrideName_04;
  logic_error *this_00;
  string_view sVar2;
  string_view sVar3;
  string_view sVar4;
  string_view sVar5;
  string_view sVar6;
  string_view sVar7;
  string_view sVar8;
  string_view sVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  string_view sVar13;
  string_view sVar14;
  string_view sVar15;
  string_view sVar16;
  string_view sVar17;
  string_view sVar18;
  string_view sVar19;
  string_view sVar20;
  string_view sVar21;
  string_view sVar22;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  SVar1 = this->kind;
  if ((ulong)SVar1 < 0x5a) {
    sVar2._M_str = (char *)((long)&switchD_00336348::switchdataD_0038d314 +
                           (long)(int)(&switchD_00336348::switchdataD_0038d314)[SVar1]);
    switch(SVar1) {
    default:
      return;
    case PredefinedIntegerType:
      sVar18._M_str = sVar2._M_str;
      sVar18._M_len = (size_t)args;
      TypePrinter::visit(visitor,(PredefinedIntegerType *)this,sVar18);
      return;
    case ScalarType:
      sVar20._M_str = sVar2._M_str;
      sVar20._M_len = (size_t)args;
      TypePrinter::visit(visitor,(ScalarType *)this,sVar20);
      return;
    case FloatingType:
      sVar19._M_str = sVar2._M_str;
      sVar19._M_len = (size_t)args;
      TypePrinter::visit(visitor,(FloatingType *)this,sVar19);
      return;
    case EnumType:
      overrideName_03._M_len = args->_M_len;
      overrideName_03._M_str = args->_M_str;
      TypePrinter::visit(visitor,(EnumType *)this,overrideName_03);
      return;
    case PackedArrayType:
      sVar11._M_str = sVar2._M_str;
      sVar11._M_len = (size_t)args;
      TypePrinter::visit(visitor,(PackedArrayType *)this,sVar11);
      return;
    case FixedSizeUnpackedArrayType:
      sVar17._M_str = sVar2._M_str;
      sVar17._M_len = (size_t)args;
      TypePrinter::visit(visitor,(FixedSizeUnpackedArrayType *)this,sVar17);
      return;
    case DynamicArrayType:
      sVar7._M_str = sVar2._M_str;
      sVar7._M_len = (size_t)args;
      TypePrinter::visit(visitor,(DynamicArrayType *)this,sVar7);
      return;
    case AssociativeArrayType:
      sVar16._M_str = sVar2._M_str;
      sVar16._M_len = (size_t)args;
      TypePrinter::visit(visitor,(AssociativeArrayType *)this,sVar16);
      return;
    case QueueType:
      sVar10._M_str = sVar2._M_str;
      sVar10._M_len = (size_t)args;
      TypePrinter::visit(visitor,(QueueType *)this,sVar10);
      return;
    case PackedStructType:
      overrideName_02._M_len = args->_M_len;
      overrideName_02._M_str = args->_M_str;
      TypePrinter::visit(visitor,(PackedStructType *)this,overrideName_02);
      return;
    case UnpackedStructType:
      overrideName._M_len = args->_M_len;
      overrideName._M_str = args->_M_str;
      TypePrinter::visit(visitor,(UnpackedStructType *)this,overrideName);
      return;
    case PackedUnionType:
      overrideName_00._M_len = args->_M_len;
      overrideName_00._M_str = args->_M_str;
      TypePrinter::visit(visitor,(PackedUnionType *)this,overrideName_00);
      return;
    case UnpackedUnionType:
      overrideName_01._M_len = args->_M_len;
      overrideName_01._M_str = args->_M_str;
      TypePrinter::visit(visitor,(UnpackedUnionType *)this,overrideName_01);
      return;
    case ClassType:
      sVar21._M_str = sVar2._M_str;
      sVar21._M_len = (size_t)args;
      TypePrinter::visit(visitor,(ClassType *)this,sVar21);
      return;
    case CovergroupType:
      sVar4._M_str = sVar2._M_str;
      sVar4._M_len = (size_t)args;
      TypePrinter::visit(visitor,(CovergroupType *)this,sVar4);
      return;
    case VoidType:
      sVar15._M_str = sVar2._M_str;
      sVar15._M_len = (size_t)args;
      TypePrinter::visit(visitor,(VoidType *)this,sVar15);
      return;
    case NullType:
      sVar8._M_str = sVar2._M_str;
      sVar8._M_len = (size_t)args;
      TypePrinter::visit(visitor,(NullType *)this,sVar8);
      return;
    case CHandleType:
      sVar14._M_str = sVar2._M_str;
      sVar14._M_len = (size_t)args;
      TypePrinter::visit(visitor,(CHandleType *)this,sVar14);
      return;
    case StringType:
      sVar22._M_str = sVar2._M_str;
      sVar22._M_len = (size_t)args;
      TypePrinter::visit(visitor,(StringType *)this,sVar22);
      return;
    case EventType:
      sVar3._M_str = sVar2._M_str;
      sVar3._M_len = (size_t)args;
      TypePrinter::visit(visitor,(EventType *)this,sVar3);
      return;
    case UnboundedType:
      sVar2._M_len = (size_t)args;
      TypePrinter::visit(visitor,(UnboundedType *)this,sVar2);
      return;
    case TypeRefType:
      sVar13._M_str = sVar2._M_str;
      sVar13._M_len = (size_t)args;
      TypePrinter::visit(visitor,(TypeRefType *)this,sVar13);
      return;
    case UntypedType:
      sVar12._M_str = sVar2._M_str;
      sVar12._M_len = (size_t)args;
      TypePrinter::visit(visitor,(UntypedType *)this,sVar12);
      return;
    case SequenceType:
      sVar5._M_str = sVar2._M_str;
      sVar5._M_len = (size_t)args;
      TypePrinter::visit(visitor,(SequenceType *)this,sVar5);
      return;
    case PropertyType:
      sVar6._M_str = sVar2._M_str;
      sVar6._M_len = (size_t)args;
      TypePrinter::visit(visitor,(PropertyType *)this,sVar6);
      return;
    case VirtualInterfaceType:
      sVar9._M_str = sVar2._M_str;
      sVar9._M_len = (size_t)args;
      TypePrinter::visit(visitor,(VirtualInterfaceType *)this,sVar9);
      return;
    case TypeAlias:
      overrideName_04._M_len = args->_M_len;
      overrideName_04._M_str = args->_M_str;
      TypePrinter::visit(visitor,(TypeAliasType *)this,overrideName_04);
      return;
    case ErrorType:
      ::fmt::v9::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (visitor->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"<error>","");
      return;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0xe4);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

decltype(auto) Symbol::visit(TVisitor&& visitor, Args&&... args) const {
    // clang-format off
#define SYMBOL(k) case SymbolKind::k: return visitor.visit(*static_cast<const k##Symbol*>(this), std::forward<Args>(args)...)
#define TYPE(k) case SymbolKind::k: return visitor.visit(*static_cast<const k*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case SymbolKind::Unknown: return visitor.visit(*this, std::forward<Args>(args)...);
        case SymbolKind::DeferredMember: return visitor.visit(*this, std::forward<Args>(args)...);
        case SymbolKind::TypeAlias: return visitor.visit(*static_cast<const TypeAliasType*>(this), std::forward<Args>(args)...);
        SYMBOL(Root);
        SYMBOL(CompilationUnit);
        SYMBOL(Attribute);
        SYMBOL(TransparentMember);
        SYMBOL(EmptyMember);
        SYMBOL(EnumValue);
        SYMBOL(ForwardingTypedef);
        SYMBOL(Parameter);
        SYMBOL(TypeParameter);
        SYMBOL(Port);
        SYMBOL(MultiPort);
        SYMBOL(InterfacePort);
        SYMBOL(Instance);
        SYMBOL(InstanceBody);
        SYMBOL(InstanceArray);
        SYMBOL(Package);
        SYMBOL(ExplicitImport);
        SYMBOL(WildcardImport);
        SYMBOL(GenerateBlock);
        SYMBOL(GenerateBlockArray);
        SYMBOL(ProceduralBlock);
        SYMBOL(StatementBlock);
        SYMBOL(Net);
        SYMBOL(Variable);
        SYMBOL(FormalArgument);
        SYMBOL(Field);
        SYMBOL(ClassProperty);
        SYMBOL(Subroutine);
        SYMBOL(Modport);
        SYMBOL(ModportPort);
        SYMBOL(ModportClocking);
        SYMBOL(ContinuousAssign);
        SYMBOL(Genvar);
        SYMBOL(ElabSystemTask);
        SYMBOL(GenericClassDef);
        SYMBOL(MethodPrototype);
        SYMBOL(UnknownModule);
        SYMBOL(Iterator);
        SYMBOL(PatternVar);
        SYMBOL(ConstraintBlock);
        SYMBOL(DefParam);
        SYMBOL(Specparam);
        SYMBOL(Primitive);
        SYMBOL(PrimitivePort);
        SYMBOL(PrimitiveInstance);
        SYMBOL(SpecifyBlock);
        SYMBOL(Sequence);
        SYMBOL(Property);
        SYMBOL(AssertionPort);
        SYMBOL(ClockingBlock);
        SYMBOL(ClockVar);
        SYMBOL(LocalAssertionVar);
        SYMBOL(LetDecl);
        SYMBOL(RandSeqProduction);
        SYMBOL(CovergroupBody);
        SYMBOL(Coverpoint);
        SYMBOL(CoverCross);
        SYMBOL(CoverCrossBody);
        SYMBOL(CoverageBin);
        TYPE(PredefinedIntegerType);
        TYPE(ScalarType);
        TYPE(FloatingType);
        TYPE(EnumType);
        TYPE(PackedArrayType);
        TYPE(FixedSizeUnpackedArrayType);
        TYPE(DynamicArrayType);
        TYPE(AssociativeArrayType);
        TYPE(QueueType);
        TYPE(PackedStructType);
        TYPE(UnpackedStructType);
        TYPE(PackedUnionType);
        TYPE(UnpackedUnionType);
        TYPE(ClassType);
        TYPE(CovergroupType);
        TYPE(VoidType);
        TYPE(NullType);
        TYPE(CHandleType);
        TYPE(StringType);
        TYPE(EventType);
        TYPE(UnboundedType);
        TYPE(TypeRefType);
        TYPE(UntypedType);
        TYPE(SequenceType);
        TYPE(PropertyType);
        TYPE(VirtualInterfaceType);
        TYPE(ErrorType);
        TYPE(NetType);
    }
#undef TYPE
#undef SYMBOL
    // clang-format on
    ASSUME_UNREACHABLE;
}